

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  int iVar1;
  int iVar2;
  Pair *pPVar3;
  ulong uVar4;
  Pair *pPVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  pPVar3 = (this->Data).Data;
  iVar1 = (this->Data).Size;
  pPVar5 = pPVar3;
  uVar7 = (long)iVar1;
  while (uVar4 = uVar7, uVar4 != 0) {
    uVar7 = uVar4 >> 1;
    if (pPVar5[uVar7].key < key) {
      pPVar5 = pPVar5 + uVar7 + 1;
      uVar7 = ~uVar7 + uVar4;
    }
  }
  if ((pPVar5 == pPVar3 + iVar1) || (pPVar5->key != key)) {
    if ((pPVar5 < pPVar3) || (pPVar3 + iVar1 < pPVar5)) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4e6,
                    "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
                   );
    }
    lVar10 = (long)pPVar5 - (long)pPVar3;
    iVar2 = (this->Data).Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      iVar11 = iVar1 + 1;
      if (iVar1 + 1 < iVar6) {
        iVar11 = iVar6;
      }
      if (iVar2 < iVar11) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        pPVar5 = (Pair *)(*GImAllocatorAllocFunc)((long)iVar11 << 4,GImAllocatorUserData);
        pPVar3 = (this->Data).Data;
        if (pPVar3 != (Pair *)0x0) {
          memcpy(pPVar5,pPVar3,(long)(this->Data).Size << 4);
          pPVar3 = (this->Data).Data;
          if (pPVar3 != (Pair *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(pPVar3,GImAllocatorUserData);
        }
        (this->Data).Data = pPVar5;
        (this->Data).Capacity = iVar11;
      }
    }
    lVar8 = (long)(this->Data).Size;
    lVar9 = lVar8 - (lVar10 >> 4);
    if (lVar9 != 0 && lVar10 >> 4 <= lVar8) {
      pPVar3 = (this->Data).Data;
      memmove((void *)((long)pPVar3 + lVar10 + 0x10),(void *)((long)pPVar3 + lVar10),lVar9 * 0x10);
    }
    pPVar3 = (this->Data).Data;
    *(ImGuiID *)((long)pPVar3 + lVar10) = key;
    *(void **)((long)pPVar3 + lVar10 + 8) = default_val;
    (this->Data).Size = (this->Data).Size + 1;
    pPVar5 = (Pair *)(lVar10 + (long)(this->Data).Data);
  }
  return (void **)&pPVar5->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_p;
}